

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O0

void msocket_ary_destroy(msocket_ary_t *self)

{
  void **local_20;
  void **ppElem;
  int32_t s32i;
  msocket_ary_t *self_local;
  
  if ((self->pDestructor != (_func_void_void_ptr *)0x0) && ((self->destructorEnable & 1U) != 0)) {
    local_20 = self->pFirst;
    for (ppElem._4_4_ = 0; ppElem._4_4_ < self->s32CurLen; ppElem._4_4_ = ppElem._4_4_ + 1) {
      (*self->pDestructor)(*local_20);
      local_20 = local_20 + 1;
    }
  }
  if (self->ppAlloc != (void **)0x0) {
    free(self->ppAlloc);
  }
  self->ppAlloc = (void **)0x0;
  self->s32AllocLen = 0;
  self->pFirst = (void **)0x0;
  self->s32CurLen = 0;
  return;
}

Assistant:

void msocket_ary_destroy(msocket_ary_t* self) {
   int32_t s32i;

   void** ppElem = self->pFirst;
   if ((self->pDestructor != 0) && (self->destructorEnable != false)) {
      for (s32i = 0; s32i < (int32_t)self->s32CurLen; s32i++) {
         self->pDestructor(*(ppElem++));
      }
   }
   if (self->ppAlloc != 0) {
      free(self->ppAlloc);
   }
   self->ppAlloc = (void**)0;
   self->s32AllocLen = 0;
   self->pFirst = (void**)0;
   self->s32CurLen = 0;
}